

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

tls_extension * bssl::tls_extension_find(uint32_t *out_index,uint16_t value)

{
  uint local_20;
  uint i;
  uint16_t value_local;
  uint32_t *out_index_local;
  
  local_20 = 0;
  while( true ) {
    if (0x1b < local_20) {
      return (tls_extension *)0x0;
    }
    if (*(uint16_t *)(kExtensions + (ulong)local_20 * 0x28) == value) break;
    local_20 = local_20 + 1;
  }
  *out_index = local_20;
  return (tls_extension *)(kExtensions + (ulong)local_20 * 0x28);
}

Assistant:

static const struct tls_extension *tls_extension_find(uint32_t *out_index,
                                                      uint16_t value) {
  unsigned i;
  for (i = 0; i < kNumExtensions; i++) {
    if (kExtensions[i].value == value) {
      *out_index = i;
      return &kExtensions[i];
    }
  }

  return NULL;
}